

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLScanner::recreateUIntPool(XMLScanner *this)

{
  MemoryManager *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint i;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    pMVar1 = this->fMemoryManager;
    if (this->fUIntPoolRow < uVar3) break;
    (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fUIntPool[uVar3]);
    uVar3 = uVar3 + 1;
  }
  (*pMVar1->_vptr_MemoryManager[4])();
  this->fUIntPoolRow = 0;
  this->fUIntPoolCol = 0;
  this->fUIntPoolRowTotal = 2;
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x10);
  this->fUIntPool = (uint **)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  *this->fUIntPool = (uint *)CONCAT44(extraout_var_00,iVar2);
  memset(this->fUIntPool[this->fUIntPoolRow],0,0x100);
  this->fUIntPool[1] = (uint *)0x0;
  return;
}

Assistant:

void XMLScanner::recreateUIntPool()
{
    // this allows a bloated unsigned int pool to be dispensed with

    // first, delete old fUIntPool
    for (unsigned int i=0; i<=fUIntPoolRow; i++)
    {
        fMemoryManager->deallocate(fUIntPool[i]);
    }
    fMemoryManager->deallocate(fUIntPool);

    fUIntPoolRow = fUIntPoolCol = 0;
    fUIntPoolRowTotal = 2;
    fUIntPool = (unsigned int **)fMemoryManager->allocate(sizeof(unsigned int *) * fUIntPoolRowTotal);
    fUIntPool[0] = (unsigned int *)fMemoryManager->allocate(sizeof(unsigned int) << 6);
    memset(fUIntPool[fUIntPoolRow], 0, sizeof(unsigned int) << 6);
    fUIntPool[1] = 0;
}